

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O1

int update_it_envelope(IT_PLAYING *playing,IT_ENVELOPE *envelope,IT_PLAYING_ENVELOPE *pe,int flags)

{
  byte bVar1;
  char cVar2;
  ushort uVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  
  if (((uint)playing->enabled_envelopes & flags) == 0) {
    return 0;
  }
  bVar1 = envelope->n_nodes;
  if ((ulong)bVar1 == 0) {
    return 0;
  }
  iVar4 = pe->tick;
  if (iVar4 < 1) {
    cVar2 = envelope->node_y[0];
LAB_006f2c68:
    iVar6 = (int)cVar2 << 8;
  }
  else {
    if ((int)(uint)envelope->node_t[bVar1 - 1] <= iVar4) {
      cVar2 = envelope->node_y[bVar1 - 1];
      goto LAB_006f2c68;
    }
    lVar8 = (long)pe->next_node;
    iVar6 = envelope->node_y[lVar8 + -1] * 0x100;
    uVar3 = envelope->node_t[lVar8 + -1];
    if (uVar3 != envelope->node_t[lVar8]) {
      iVar6 = iVar6 + (int)((iVar4 - (uint)uVar3) *
                            ((int)envelope->node_y[lVar8] - (int)envelope->node_y[lVar8 + -1]) *
                           0x100) / (int)((uint)envelope->node_t[lVar8] - (uint)uVar3);
    }
  }
  pe->value = iVar6;
  pe->tick = iVar4 + 1;
  uVar7 = bVar1 - 1;
  if (uVar7 != 0) {
    uVar5 = 0;
    do {
      if (iVar4 < (int)(uint)envelope->node_t[uVar5]) {
        uVar7 = (uint)uVar5;
        break;
      }
      uVar5 = uVar5 + 1;
    } while (uVar7 != uVar5);
  }
  pe->next_node = uVar7;
  if (((envelope->flags & 4) == 0) || ((playing->flags & 2) != 0)) {
    if ((envelope->flags & 2) == 0) {
      if ((int)(uint)envelope->node_t[(ulong)bVar1 - 1] <= iVar4) {
        return 1;
      }
    }
    else if ((int)(uint)envelope->node_t[envelope->loop_end] <= iVar4) {
      bVar1 = envelope->loop_start;
      goto LAB_006f2ce7;
    }
  }
  else if ((int)(uint)envelope->node_t[envelope->sus_loop_end] <= iVar4) {
    bVar1 = envelope->sus_loop_start;
LAB_006f2ce7:
    pe->next_node = bVar1 + 1;
    pe->tick = (uint)envelope->node_t[bVar1];
    return 0;
  }
  return 0;
}

Assistant:

static int update_it_envelope(IT_PLAYING *playing, IT_ENVELOPE *envelope, IT_PLAYING_ENVELOPE *pe, int flags)
{
	if (!(playing->enabled_envelopes & flags) || !envelope->n_nodes)
		return 0;

	ASSERT(envelope->n_nodes > 0);

	if (pe->tick <= 0)
		pe->value = envelope->node_y[0] << IT_ENVELOPE_SHIFT;
	else if (pe->tick >= envelope->node_t[envelope->n_nodes-1]) {
		pe->value = envelope->node_y[envelope->n_nodes-1] << IT_ENVELOPE_SHIFT;
	} else {
		int ys = envelope->node_y[pe->next_node-1] << IT_ENVELOPE_SHIFT;
		int ts = envelope->node_t[pe->next_node-1];
		int te = envelope->node_t[pe->next_node];

		if (ts == te)
			pe->value = ys;
		else {
			int ye = envelope->node_y[pe->next_node] << IT_ENVELOPE_SHIFT;
			int t = pe->tick;

			pe->value = ys + (ye - ys) * (t - ts) / (te - ts);
		}
	}

	pe->tick++;

	recalculate_it_envelope_node(pe, envelope);

	if ((envelope->flags & IT_ENVELOPE_SUSTAIN_LOOP) && !(playing->flags & IT_PLAYING_SUSTAINOFF)) {
		if (pe->tick > envelope->node_t[envelope->sus_loop_end]) {
			pe->next_node = envelope->sus_loop_start + 1;
			ASSERT(pe->next_node <= envelope->n_nodes);
			pe->tick = envelope->node_t[envelope->sus_loop_start];
			return 0;
		}
	} else if (envelope->flags & IT_ENVELOPE_LOOP_ON) {
		if (pe->tick > envelope->node_t[envelope->loop_end]) {
			pe->next_node = envelope->loop_start + 1;
			ASSERT(pe->next_node <= envelope->n_nodes);
			pe->tick = envelope->node_t[envelope->loop_start];
			return 0;
		}
	}
	else if (pe->tick > envelope->node_t[envelope->n_nodes - 1])
		return 1;

	return 0;
}